

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream.hpp
# Opt level: O0

string * __thiscall
iutest::detail::IInStream::ReadAll_abi_cxx11_(string *__return_storage_ptr__,IInStream *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  char *pcVar4;
  char *buf;
  size_t size;
  IInStream *this_local;
  string *str;
  long lVar3;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar1 = (*this->_vptr_IInStream[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 != 0) {
    pcVar4 = (char *)operator_new__(lVar3 + 1);
    pcVar4[lVar3] = '\0';
    uVar2 = (*this->_vptr_IInStream[2])(this,pcVar4,lVar3,1);
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
    }
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ::std::string ReadAll()
    {
        ::std::string str;
        const size_t size = static_cast<size_t>(GetSize());
        if( size != 0 )
        {
            char* buf = new char[size+1];
            buf[size] = '\0';
            if( Read(buf, size, 1) )
            {
                str = buf;
            }
            delete [] buf;
        }
        return str;
    }